

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O0

int tnt_init(tnt_stream *s)

{
  void *pvVar1;
  int iVar2;
  tnt_schema *ptVar3;
  tnt_stream_net *sn;
  tnt_stream *s_local;
  
  pvVar1 = s->data;
  ptVar3 = tnt_schema_new((tnt_schema *)0x0);
  *(tnt_schema **)((long)pvVar1 + 0x100) = ptVar3;
  if (ptVar3 == (tnt_schema *)0x0) {
    *(undefined4 *)((long)pvVar1 + 0xf0) = 2;
    s_local._4_4_ = -1;
  }
  else {
    iVar2 = tnt_iob_init((tnt_iob *)((long)pvVar1 + 0x80),(long)*(int *)((long)pvVar1 + 0x58),
                         *(tnt_iob_tx_t *)((long)pvVar1 + 0x40),
                         *(tnt_iob_txv_t *)((long)pvVar1 + 0x48),*(void **)((long)pvVar1 + 0x50));
    if (iVar2 == -1) {
      *(undefined4 *)((long)pvVar1 + 0xf0) = 2;
      s_local._4_4_ = -1;
    }
    else {
      iVar2 = tnt_iob_init((tnt_iob *)((long)pvVar1 + 0xb8),(long)*(int *)((long)pvVar1 + 0x70),
                           *(tnt_iob_tx_t *)((long)pvVar1 + 0x60),(tnt_iob_txv_t)0x0,
                           *(void **)((long)pvVar1 + 0x68));
      if (iVar2 == -1) {
        *(undefined4 *)((long)pvVar1 + 0xf0) = 2;
        s_local._4_4_ = -1;
      }
      else {
        *(undefined4 *)((long)pvVar1 + 0x108) = 1;
        s_local._4_4_ = 0;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

int tnt_init(struct tnt_stream *s) {
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if ((sn->schema = tnt_schema_new(NULL)) == NULL) {
		sn->error = TNT_EMEMORY;
		return -1;
	}
	if (tnt_iob_init(&sn->sbuf, sn->opt.send_buf, sn->opt.send_cb,
		sn->opt.send_cbv, sn->opt.send_cb_arg) == -1) {
		sn->error = TNT_EMEMORY;
		return -1;
	}
	if (tnt_iob_init(&sn->rbuf, sn->opt.recv_buf, sn->opt.recv_cb, NULL,
		sn->opt.recv_cb_arg) == -1) {
		sn->error = TNT_EMEMORY;
		return -1;
	}
	sn->inited = 1;
	return 0;
}